

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IResultCapture * Catch::getResultCapture(void)

{
  undefined **ppuVar1;
  IResultCapture *pIVar2;
  SourceLineInfo local_58;
  ReusableStringStream local_48;
  string local_30;
  
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar1 = &PTR__Context_00233b40;
    *IMutableContext::currentContext = &PTR__Context_00233b40;
    IMutableContext::currentContext[1] = &PTR__Context_00233b90;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar1 = (undefined **)*IMutableContext::currentContext;
  }
  pIVar2 = (IResultCapture *)(*(code *)ppuVar1[2])();
  if (pIVar2 != (IResultCapture *)0x0) {
    return pIVar2;
  }
  ReusableStringStream::ReusableStringStream(&local_48);
  local_58.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp"
  ;
  local_58.line = 0x3354;
  operator<<(local_48.m_oss,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_48.m_oss,": Internal Catch2 error: ",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_48.m_oss,"No result capture instance",0x1a);
  std::__cxx11::stringbuf::str();
  throw_logic_error(&local_30);
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }